

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O1

void __thiscall
CServerBrowserFilter::Sort
          (CServerBrowserFilter *this,CServerEntry **ppServerlist,int NumServers,int ResortFlags)

{
  uint uVar1;
  CServerFilter *pCVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  this->m_ppServerlist = ppServerlist;
  this->m_NumServers = NumServers;
  if (0 < (this->m_lFilters).num_elements) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      pCVar2 = (this->m_lFilters).list;
      if (((ResortFlags & 1U) != 0) ||
         ((((ResortFlags & 2U) != 0 &&
           ((*(byte *)((long)&((CServerFilterInfo *)((pCVar2->m_FilterInfo).m_aGametype + -1))->
                              m_SortHash + lVar5 + 1) & 4) != 0)) ||
          (uVar1 = *(uint *)((long)&((CServerFilterInfo *)((pCVar2->m_FilterInfo).m_aGametype + -1))
                                    ->m_SortHash + lVar5),
          lVar3 = **(long **)((long)((pCVar2->m_FilterInfo).m_aGametype + -2) + 8 + lVar5),
          uVar1 != (uVar1 & 0x7ff0 | (*(uint *)(lVar3 + 0xe64) & 7) + *(int *)(lVar3 + 0xe68) * 8)))
         )) {
        CServerFilter::Sort((CServerFilter *)
                            ((long)((pCVar2->m_FilterInfo).m_aGametype + -2) + 8 + lVar5));
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0xe8;
    } while (lVar4 < (this->m_lFilters).num_elements);
  }
  return;
}

Assistant:

void CServerBrowserFilter::Sort(CServerEntry **ppServerlist, int NumServers, int ResortFlags)
{
	m_ppServerlist = ppServerlist;
	m_NumServers = NumServers;
	for(int i = 0; i < m_lFilters.size(); i++)
	{
		// check if we need to resort
		CServerFilter *pFilter = &m_lFilters[i];
		if((ResortFlags&RESORT_FLAG_FORCE) || ((ResortFlags&RESORT_FLAG_FAV) && pFilter->m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FAVORITE) || pFilter->m_FilterInfo.m_SortHash != pFilter->GetSortHash())
			pFilter->Sort();
	}
}